

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpztriangle.cpp
# Opt level: O3

void pztopology::TPZTriangle::ComputeHCurlDirections<double>
               (TPZFMatrix<double> *gradx,TPZFMatrix<double> *directions,
               TPZVec<int> *transformationIds)

{
  int iVar1;
  int64_t size;
  double *pdVar2;
  int *piVar3;
  double dVar4;
  double dVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  TPZManVector<double,_3> edgeSign;
  TPZManVector<double,_3> v2;
  TPZManVector<double,_3> v1;
  TPZManVector<double,_3> local_e0;
  TPZManVector<double,_3> local_a8;
  TPZManVector<double,_3> local_70;
  double local_38;
  
  size = (gradx->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
  TPZManVector<double,_3>::TPZManVector(&local_70,size);
  TPZManVector<double,_3>::TPZManVector(&local_a8,size);
  if (0 < size) {
    lVar6 = (gradx->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    lVar7 = 0;
    do {
      if ((lVar6 <= lVar7) || ((gradx->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      pdVar2 = gradx->fElem;
      local_70.super_TPZVec<double>.fStore[lVar7] = pdVar2[lVar7];
      if ((lVar6 <= lVar7) || ((gradx->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 2)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      local_a8.super_TPZVec<double>.fStore[lVar7] = pdVar2[lVar6 + lVar7];
      lVar7 = lVar7 + 1;
    } while (size != lVar7);
  }
  iVar1 = transformationIds->fStore[3];
  local_38 = 0.0;
  TPZManVector<double,_3>::TPZManVector(&local_e0,3,&local_38);
  piVar3 = transformationIds->fStore;
  lVar6 = 0;
  do {
    local_e0.super_TPZVec<double>.fStore[lVar6] = (double)(int)(-(uint)(piVar3[lVar6] != 0) | 1);
    lVar6 = lVar6 + 1;
  } while (lVar6 != 3);
  if (0 < size) {
    dVar4 = (double)(int)(-(*(byte *)(piVar3 + 3) & 1) | 1);
    lVar7 = (long)(iVar1 * 2);
    lVar6 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    lVar8 = 0;
    do {
      if ((lVar6 <= lVar8) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1))
      {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      pdVar2 = directions->fElem;
      pdVar2[lVar8] =
           local_70.super_TPZVec<double>.fStore[lVar8] * *local_e0.super_TPZVec<double>.fStore;
      if ((lVar6 <= lVar8) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 2))
      {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      pdVar2[lVar6 + lVar8] =
           (local_70.super_TPZVec<double>.fStore[lVar8] +
           local_a8.super_TPZVec<double>.fStore[lVar8]) * *local_e0.super_TPZVec<double>.fStore;
      if ((lVar6 <= lVar8) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 3))
      {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      pdVar2[lVar6 * 2 + lVar8] =
           (local_a8.super_TPZVec<double>.fStore[lVar8] * 1.4142135623730951 *
           local_e0.super_TPZVec<double>.fStore[1]) / 1.4142135623730951;
      if ((lVar6 <= lVar8) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 4))
      {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      pdVar2[lVar6 * 3 + lVar8] =
           (local_70.super_TPZVec<double>.fStore[lVar8] * -1.4142135623730951 *
           local_e0.super_TPZVec<double>.fStore[1]) / 1.4142135623730951;
      if ((lVar6 <= lVar8) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 5))
      {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      pdVar2[lVar6 * 4 + lVar8] =
           local_e0.super_TPZVec<double>.fStore[2] *
           -(local_70.super_TPZVec<double>.fStore[lVar8] +
            local_a8.super_TPZVec<double>.fStore[lVar8]);
      if ((lVar6 <= lVar8) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 6))
      {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      pdVar2[lVar6 * 5 + lVar8] =
           local_e0.super_TPZVec<double>.fStore[2] * -local_a8.super_TPZVec<double>.fStore[lVar8];
      if ((lVar6 <= lVar8) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 7))
      {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      pdVar2[lVar6 * 6 + lVar8] =
           (local_a8.super_TPZVec<double>.fStore[lVar8] * 0.5 +
           local_70.super_TPZVec<double>.fStore[lVar8]) * *local_e0.super_TPZVec<double>.fStore;
      if ((lVar6 <= lVar8) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 8))
      {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      pdVar2[lVar6 * 7 + lVar8] =
           ((local_a8.super_TPZVec<double>.fStore[lVar8] -
            local_70.super_TPZVec<double>.fStore[lVar8]) * 0.7071067811865476 *
           local_e0.super_TPZVec<double>.fStore[1]) / 1.4142135623730951;
      if ((lVar6 <= lVar8) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 9))
      {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      pdVar2[lVar6 * 8 + lVar8] =
           (local_70.super_TPZVec<double>.fStore[lVar8] * -0.5 -
           local_a8.super_TPZVec<double>.fStore[lVar8]) * local_e0.super_TPZVec<double>.fStore[2];
      if ((lVar6 <= lVar8) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 10))
      {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      dVar5 = *local_e0.super_TPZVec<double>.fStore * dVar4 *
              local_a8.super_TPZVec<double>.fStore[lVar8];
      pdVar2[lVar6 * 9 + lVar8] = dVar5 + dVar5;
      if ((lVar6 <= lVar8) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0xb)
         ) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      dVar5 = (-local_a8.super_TPZVec<double>.fStore[lVar8] -
              local_70.super_TPZVec<double>.fStore[lVar8]) *
              local_e0.super_TPZVec<double>.fStore[1] * dVar4;
      pdVar2[lVar6 * 10 + lVar8] = dVar5 + dVar5;
      if ((lVar6 <= lVar8) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0xc)
         ) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      dVar5 = local_e0.super_TPZVec<double>.fStore[2] * dVar4 *
              local_70.super_TPZVec<double>.fStore[lVar8];
      pdVar2[lVar6 * 0xb + lVar8] = dVar5 + dVar5;
      if ((lVar6 <= lVar8) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0xd)
         ) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      pdVar2[lVar6 * 0xc + lVar8] = fTangentVectors[lVar7][lVar8];
      if ((lVar6 <= lVar8) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0xe)
         ) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      pdVar2[lVar6 * 0xd + lVar8] = *(double *)(lVar7 * 0x10 + 0x151d740 + lVar8 * 8);
      lVar8 = lVar8 + 1;
    } while (size != lVar8);
  }
  TPZManVector<double,_3>::~TPZManVector(&local_e0);
  TPZManVector<double,_3>::~TPZManVector(&local_a8);
  TPZManVector<double,_3>::~TPZManVector(&local_70);
  return;
}

Assistant:

void TPZTriangle::ComputeHCurlDirections(TPZFMatrix<TVar> &gradx, TPZFMatrix<TVar> &directions, const TPZVec<int> &transformationIds)
    {
        const auto dim = gradx.Rows();
        TPZManVector<TVar, 3> v1(dim),v2(dim);
        for (int i=0; i<dim; i++) {
            v1[i] = gradx(i,0);
            v2[i] = gradx(i,1);
        }
        constexpr auto nEdges{3}, nFaces{1};
        constexpr REAL faceArea{TPZTriangle::RefElVolume()};
        constexpr REAL edgeLength[nEdges]{1,M_SQRT2,1};
        const int facePermute = transformationIds[nEdges];
        TPZManVector<REAL,nEdges> edgeSign(nEdges,0);
        for(auto iEdge = 0; iEdge < nEdges; iEdge++){
            edgeSign[iEdge] = transformationIds[iEdge] == 0 ? 1 : -1;
        }
        const int faceOrient =  transformationIds[nEdges] % 2 == 0 ? 1 : -1;

        for (int i=0; i<dim; i++)
        {
            //v^{e,a} constant vector fields associated with edge e and vertex a
            //they are defined in such a way that v^{e,a} is normal to the edge \hat{e}
            //adjacent to edge e by the vertex a. the tangential component is set to be 1 /edgeLength[e]
            directions(i,0) = (v1[i]) * edgeSign[0] / edgeLength[0];
            directions(i,1) = (v1[i]+v2[i]) * edgeSign[0] / edgeLength[0];
            directions(i,2) = (v2[i]*M_SQRT2) * edgeSign[1] / edgeLength[1];
            directions(i,3) = (-v1[i]*M_SQRT2) * edgeSign[1] / edgeLength[1];
            directions(i,4) = (v1[i] + v2[i]) * -1 * edgeSign[2] / edgeLength[2];
            directions(i,5) = (-v2[i]) * edgeSign[2] / edgeLength[2];

            //v^{e,T} constant vector fields associated with edge e and aligned with it
            directions(i,6) = (v1[i]+0.5*v2[i]) * edgeSign[0] / edgeLength[0];
            directions(i,7) = ((-v1[i]+v2[i]) * M_SQRT1_2) * edgeSign[1] / edgeLength[1];
            directions(i,8) = (-0.5*v1[i]-v2[i]) * edgeSign[2] / edgeLength[2];

            //v^{F,e} constant vector fields associated with face F and edge e
            //they are defined in such a way that v^{F,e} is normal to the face \hat{F}
            //adjacent to face F by edge e
            directions(i,9)  = faceOrient * edgeSign[0] *  v2[i] /faceArea;//* edgeLength[0];
            directions(i,10) = faceOrient * edgeSign[1] *  (-v2[i]-v1[i]) /faceArea;//* edgeLength[1];
            directions(i,11) = faceOrient * edgeSign[2] *  v1[i] /faceArea;//* edgeLength[0];

            //v^{F,T} orthonormal vectors associated with face F and tangent to it.
            directions(i,12) = fTangentVectors[2*facePermute][i];
            directions(i,13) = fTangentVectors[2*facePermute + 1][i];
        }
    }